

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_etc.cpp
# Opt level: O2

uint64 crnlib::pack_etc1_block
                 (etc1_block *dst_block,color_quad_u8 *pSrc_pixels,crn_etc1_pack_params *pack_params
                 ,pack_etc1_block_context *context)

{
  ushort uVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  results *prVar5;
  undefined4 uVar6;
  int iVar7;
  color_quad_u8 *pcVar8;
  ushort uVar9;
  ushort uVar10;
  int iVar11;
  long lVar12;
  uint8 (*pauVar13) [8];
  ulong uVar14;
  uint uVar15;
  byte bVar16;
  int iVar17;
  int iVar18;
  uint uVar19;
  uint uVar20;
  uint64 uVar21;
  ulong uVar22;
  uchar uVar23;
  uint uVar24;
  uint uVar25;
  results *prVar26;
  byte bVar27;
  ulong uVar28;
  long lVar29;
  ushort uVar30;
  uint uVar31;
  results *prVar32;
  uint32 uVar33;
  uint uVar34;
  ushort *puVar35;
  uint use_color4;
  int iVar36;
  bool bVar37;
  uint64 local_268;
  undefined4 local_25c;
  ulong local_258;
  int local_24c;
  uint local_248;
  uint local_244;
  uint local_240;
  uint local_23c;
  color_quad_u8 *local_238;
  ulong local_230;
  uint8 best_selectors [2] [8];
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  ulong local_1c8;
  ulong local_1c0;
  undefined4 local_1b8;
  undefined4 uStack_1b4;
  undefined4 uStack_1b0;
  undefined4 uStack_1ac;
  ulong local_1a8;
  ulong local_1a0;
  results results [3];
  crn_etc1_pack_params local_120;
  undefined4 local_118;
  undefined8 *local_110;
  undefined1 local_108;
  int *local_100;
  undefined4 local_f8;
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 aStack_f4;
  undefined1 local_f0;
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 local_e0;
  uint local_dc;
  undefined4 local_d8;
  uint8 (*local_d0 [3]) [8];
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 local_b8;
  uint local_b4;
  undefined4 local_b0;
  uint8 (*local_a8) [8];
  uint8 selectors [3] [8];
  color_quad_u8 dithered_pixels [16];
  
  uVar24 = 0xf;
  do {
    if (uVar24 == 0) {
      uVar24 = 0xffffffff;
      local_268 = 0;
      uVar15 = 0;
      uVar25 = 0;
      uVar20 = 0;
      uVar22 = 0;
      uVar14 = 0;
      while (uVar28 = uVar14, uVar28 != 3) {
        for (iVar17 = -1; uVar14 = uVar28 + 1, iVar17 != 2; iVar17 = iVar17 + 1) {
          iVar7 = iVar17 + (uint)(pSrc_pixels->field_0).c[uVar28];
          if (0xfe < iVar7) {
            iVar7 = 0xff;
          }
          if (iVar7 < 1) {
            iVar7 = 0;
          }
          puVar35 = &g_color8_to_etc_block_config_0_255;
          if (iVar7 != 0) {
            if (iVar7 == 0xff) {
              puVar35 = &DAT_0018d7f2;
            }
            else {
              puVar35 = (ushort *)
                        (g_color8_to_etc_block_config_1_to_254 + (long)(iVar7 + -1) * 0x18);
            }
          }
          iVar7 = iVar7 - (uint)(pSrc_pixels->field_0).c[uVar28];
          uVar9 = *puVar35;
          do {
            puVar35 = puVar35 + 1;
            uVar19 = (uint)uVar9;
            uVar10 = *(ushort *)
                      (g_etc1_inverse_lookup +
                      (ulong)(pSrc_pixels->field_0).c
                             [(uint)(&rg_etc1::
                                      pack_etc1_block_solid_color_constrained(crnlib::rg_etc1::etc1_optimizer::results&,unsigned_int,unsigned_char_const*,bool,crnlib::rg_etc1::color_quad_u8_const*)
                                      ::s_next_comp)[uVar28]] * 2 + (ulong)(byte)uVar9 * 0x200);
            uVar1 = *(ushort *)
                     (g_etc1_inverse_lookup +
                     (ulong)(pSrc_pixels->field_0).c[(uint)(&DAT_0018d644)[uVar28]] * 2 +
                     (ulong)(byte)uVar9 * 0x200);
            uVar34 = (uint)(uVar10 >> 8);
            uVar31 = (uint)(uVar1 >> 8);
            uVar31 = uVar31 * uVar31 + uVar34 * uVar34 + iVar7 * iVar7;
            if (uVar31 < uVar24) {
              uVar25 = uVar10 & 0xff;
              uVar15 = uVar1 & 0xff;
              if (uVar31 == 0) goto LAB_00172531;
              uVar20 = (uint)uVar9;
              uVar22 = uVar28 & 0xffffffff;
              uVar24 = uVar31;
            }
            uVar9 = *puVar35;
          } while (uVar9 != 0xffff);
        }
      }
      local_268 = (ulong)uVar24 << 4;
      uVar28 = uVar22;
      uVar19 = uVar20;
LAB_00172531:
      (dst_block->field_0).m_bytes[3] =
           ((byte)(uVar19 >> 1) & 7) * '$' + (char)(uVar19 & 1) * '\x02';
      bVar16 = *(byte *)((long)&g_selector_index_to_etc1 + (ulong)(uVar19 >> 4 & 3));
      *(short *)((long)&dst_block->field_0 + 4) = (short)((int)((uint)bVar16 << 0x1e) >> 0x1f);
      *(ushort *)((long)&dst_block->field_0 + 6) = -(bVar16 & 1);
      if ((uVar19 & 1) == 0) {
        dst_block->m_low_color[(uVar28 & 0xffffffff) - 8] =
             (byte)((uVar19 >> 8) << 4) | (byte)(uVar19 >> 8);
        dst_block->m_low_color
        [(ulong)(uint)(&rg_etc1::
                        pack_etc1_block_solid_color_constrained(crnlib::rg_etc1::etc1_optimizer::results&,unsigned_int,unsigned_char_const*,bool,crnlib::rg_etc1::color_quad_u8_const*)
                        ::s_next_comp)[uVar28 & 0xffffffff] - 8] =
             (byte)(uVar25 << 4) | (byte)uVar25;
        bVar16 = (byte)(uVar15 << 4) | (byte)uVar15;
      }
      else {
        dst_block->m_low_color[(uVar28 & 0xffffffff) - 8] = (uint8)((uVar19 >> 8) << 3);
        dst_block->m_low_color
        [(ulong)(uint)(&rg_etc1::
                        pack_etc1_block_solid_color_constrained(crnlib::rg_etc1::etc1_optimizer::results&,unsigned_int,unsigned_char_const*,bool,crnlib::rg_etc1::color_quad_u8_const*)
                        ::s_next_comp)[uVar28 & 0xffffffff] - 8] = (byte)uVar25 << 3;
        bVar16 = (byte)uVar15 << 3;
      }
      dst_block->m_low_color
      [(ulong)(uint)(&rg_etc1::
                      pack_etc1_block_solid_color_constrained(crnlib::rg_etc1::etc1_optimizer::results&,unsigned_int,unsigned_char_const*,bool,crnlib::rg_etc1::color_quad_u8_const*)
                      ::s_next_comp)[(int)uVar28 + 1] - 8] = bVar16;
      return local_268;
    }
  } while (((pSrc_pixels[uVar24].field_0.field_0.r == (pSrc_pixels->field_0).field_0.r) &&
           (pSrc_pixels[uVar24].field_0.field_0.g == (pSrc_pixels->field_0).field_0.g)) &&
          (uVar14 = (ulong)uVar24, uVar24 = uVar24 - 1,
          pSrc_pixels[uVar14].field_0.field_0.b == (pSrc_pixels->field_0).field_0.b));
  if (pack_params->m_dithering == true) {
    prVar32 = results;
    pcVar8 = dithered_pixels;
    prVar26 = (results *)&results[0].m_n;
    for (lVar12 = 0; lVar12 != 3; lVar12 = lVar12 + 1) {
      results[0].m_n = 0;
      results[0]._20_4_ = 0;
      results[0].m_pSelectors = (uint8 *)0x0;
      results[0].m_error = 0;
      results[0].m_block_color_unscaled.field_0 =
           (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)0x0;
      results[0].m_block_inten_table = 0;
      prVar5 = prVar26;
      for (lVar29 = 0; prVar26 = prVar5, (int)lVar29 != 0x40; lVar29 = lVar29 + 0x10) {
        bVar16 = (pSrc_pixels->field_0).c[lVar29];
        bVar27 = (&DAT_001cb558)
                 [(long)((int)prVar26->m_error * 5 + *(int *)((long)&prVar26->m_error + 4) * 3 >> 4)
                  + (ulong)bVar16];
        (pcVar8->field_0).c[lVar29] = bVar27;
        iVar17 = (uint)bVar16 - (uint)bVar27;
        *(int *)&prVar32->m_error = iVar17;
        bVar16 = pSrc_pixels[1].field_0.c[lVar29];
        bVar27 = (&DAT_001cb558)
                 [(long)((int)(*(int *)((long)&prVar26->m_error + 4) * 5 +
                               (prVar26->m_block_color_unscaled).field_0.m_u32 * 3 + iVar17 * 7 +
                              (int)prVar26->m_error) >> 4) + (ulong)bVar16];
        pcVar8[1].field_0.c[lVar29] = bVar27;
        iVar17 = (uint)bVar16 - (uint)bVar27;
        *(int *)((long)&prVar32->m_error + 4) = iVar17;
        bVar16 = pSrc_pixels[2].field_0.c[lVar29];
        bVar27 = (&DAT_001cb558)
                 [(long)((int)((prVar26->m_block_color_unscaled).field_0.m_u32 * 5 +
                               prVar26->m_block_inten_table * 3 + iVar17 * 7 +
                              *(int *)((long)&prVar26->m_error + 4)) >> 4) + (ulong)bVar16];
        pcVar8[2].field_0.c[lVar29] = bVar27;
        uVar33 = (uint)bVar16 - (uint)bVar27;
        (prVar32->m_block_color_unscaled).field_0.m_u32 = uVar33;
        bVar16 = pSrc_pixels[3].field_0.c[lVar29];
        bVar27 = (&DAT_001cb558)
                 [(long)((int)(prVar26->m_block_inten_table * 5 + uVar33 * 7 +
                              (prVar26->m_block_color_unscaled).field_0.m_u32) >> 4) + (ulong)bVar16
                 ];
        pcVar8[3].field_0.c[lVar29] = bVar27;
        prVar32->m_block_inten_table = (uint)bVar16 - (uint)bVar27;
        prVar5 = prVar32;
        prVar32 = prVar26;
      }
      pSrc_pixels = (color_quad_u8 *)((long)&pSrc_pixels->field_0 + 1);
      pcVar8 = (color_quad_u8 *)((long)&pcVar8->field_0 + 1);
    }
    pSrc_pixels = dithered_pixels;
  }
  local_d8 = 8;
  local_d0[0] = best_selectors;
  local_b0 = 8;
  local_a8 = best_selectors + 1;
  pauVar13 = selectors;
  for (lVar12 = 3; lVar12 != 0x12; lVar12 = lVar12 + 5) {
    *(undefined4 *)((long)results + lVar12 * 8 + -8) = 8;
    (&results[0].m_error)[lVar12] = (uint64)pauVar13;
    pauVar13 = pauVar13 + 1;
  }
  local_120 = *pack_params;
  local_108 = 0;
  local_100 = &etc1_optimizer::params::clear_optimizer_params()::s_default_scan_delta;
  local_f8 = 1;
  aStack_f4.m_u32 = 0;
  local_f0 = 0;
  local_118 = 8;
  local_110 = &local_1e8;
  local_248 = local_dc;
  local_1c8 = (ulong)local_b4;
  uVar21 = 0xffffffffffffffff;
  iVar17 = 0;
  local_24c = 0;
  local_238 = pSrc_pixels;
  for (iVar7 = 0; iVar7 != 2; iVar7 = iVar7 + 1) {
    for (iVar36 = 0; iVar36 != 2; iVar36 = iVar36 + 1) {
      lVar12 = 0;
      uVar14 = 0;
      do {
        if (lVar12 == 2) {
          local_e0 = results[0].m_block_color_unscaled.field_0;
          local_248 = results[0].m_block_inten_table;
          memcpy(best_selectors,results[0].m_pSelectors,results[0]._16_8_ & 0xffffffff);
          local_b8 = results[1].m_block_color_unscaled.field_0;
          local_1c8 = (ulong)results[1].m_block_inten_table;
          memcpy(best_selectors + 1,results[1].m_pSelectors,(ulong)results[1].m_n);
          local_24c = iVar7;
          uVar21 = uVar14;
          iVar17 = iVar36;
          break;
        }
        local_1a0 = uVar14;
        if (iVar7 == 0) {
          local_1e8 = CONCAT44(local_1e8._4_4_,pSrc_pixels[lVar12 * 2].field_0.m_u32);
          local_1e8 = CONCAT44(pSrc_pixels[lVar12 * 2 + 4].field_0.m_u32,
                               pSrc_pixels[lVar12 * 2].field_0.m_u32);
          uStack_1e0 = CONCAT44(uStack_1e0._4_4_,pSrc_pixels[lVar12 * 2 + 8].field_0.m_u32);
          uStack_1e0 = CONCAT44(pSrc_pixels[lVar12 * 2 + 0xc].field_0.m_u32,
                                pSrc_pixels[lVar12 * 2 + 8].field_0.m_u32);
          local_1d8 = CONCAT44(local_1d8._4_4_,pSrc_pixels[lVar12 * 2 + 1].field_0.m_u32);
          local_1d8 = CONCAT44(pSrc_pixels[lVar12 * 2 + 5].field_0.m_u32,
                               pSrc_pixels[lVar12 * 2 + 1].field_0.m_u32);
          uStack_1d0 = CONCAT44(uStack_1d0._4_4_,pSrc_pixels[lVar12 * 2 + 9].field_0.m_u32);
          uStack_1d0 = CONCAT44(pSrc_pixels[lVar12 * 2 + 0xd].field_0.m_u32,
                                pSrc_pixels[lVar12 * 2 + 9].field_0.m_u32);
        }
        else {
          local_1d8 = *(undefined8 *)(pSrc_pixels + lVar12 * 8 + 4);
          uStack_1d0 = *(undefined8 *)(pSrc_pixels + lVar12 * 8 + 4 + 2);
          local_1e8 = *(undefined8 *)(pSrc_pixels + lVar12 * 8);
          uStack_1e0 = *(undefined8 *)(pSrc_pixels + lVar12 * 8 + 2);
        }
        results[2].m_error = 0xffffffffffffffff;
        uVar6 = local_1b8;
        if ((iVar36 != 0 || (int)lVar12 != 0) && local_120.m_quality != cCRNETCQualityFast) {
          local_25c = (undefined4)local_1e8;
          local_1b8 = (undefined4)local_1e8;
          uVar6 = local_1b8;
          uStack_1b4 = local_1e8._4_4_;
          uStack_1b0 = (undefined4)uStack_1e0;
          uStack_1ac = uStack_1e0._4_4_;
          local_1b8._0_1_ = (char)local_1e8;
          local_1b8._1_1_ = (char)((ulong)local_1e8 >> 8);
          local_1b8._2_1_ = (char)((ulong)local_1e8 >> 0x10);
          uVar24 = 7;
          uVar14 = 7;
LAB_00171c33:
          bVar37 = uVar24 != 0;
          uVar24 = uVar24 - 1;
          if (bVar37) goto code_r0x00171c38;
          pcVar8 = (color_quad_u8 *)0x0;
          if (lVar12 != 0 && iVar36 == 0) {
            pcVar8 = &results[0].m_block_color_unscaled;
          }
          local_240 = 0;
          local_244 = 0;
          local_258 = 0xffffffffffffffff;
          uVar14 = 0;
          uVar22 = 0;
          uVar24 = 0;
          while (uVar28 = uVar14, pSrc_pixels = local_238, uVar28 != 3) {
            local_23c = uVar24;
            local_1c0 = uVar22;
            local_230 = (ulong)(uint)(&DAT_0018d644)[uVar28];
            local_1a8 = uVar28 + 1;
            for (iVar11 = -1; uVar14 = local_1a8, uVar22 = local_1c0, uVar24 = local_23c,
                iVar11 != 2; iVar11 = iVar11 + 1) {
              iVar18 = iVar11 + (uint)*(byte *)((long)&local_25c + uVar28);
              if (0xfe < iVar18) {
                iVar18 = 0xff;
              }
              if (iVar18 < 1) {
                iVar18 = 0;
              }
              puVar35 = &g_color8_to_etc_block_config_0_255;
              if (iVar18 != 0) {
                if (iVar18 == 0xff) {
                  puVar35 = &DAT_0018d7f2;
                }
                else {
                  puVar35 = (ushort *)
                            (g_color8_to_etc_block_config_1_to_254 + (long)(iVar18 + -1) * 0x18);
                }
              }
              iVar18 = iVar18 - (uint)*(byte *)((long)&local_25c + uVar28);
              uVar9 = *puVar35;
              do {
                puVar35 = puVar35 + 1;
                bVar16 = (byte)uVar9;
                if ((iVar36 == 0) == (bool)(bVar16 & 1)) {
                  bVar27 = (lVar12 != 0 && iVar36 == 0) & bVar16;
                  if ((bVar27 != 1) ||
                     (((uint)(uVar9 >> 8) - (uint)(pcVar8->field_0).c[uVar28]) + 4 < 8)) {
                    uVar10 = *(ushort *)
                              (g_etc1_inverse_lookup +
                              (ulong)*(byte *)((long)&local_25c +
                                              (ulong)(uint)(&rg_etc1::
                                                  pack_etc1_block_solid_color_constrained(crnlib::rg_etc1::etc1_optimizer::results&,unsigned_int,unsigned_char_const*,bool,crnlib::rg_etc1::color_quad_u8_const*)
                                                  ::s_next_comp)[uVar28]) * 2 +
                              (ulong)bVar16 * 0x200);
                    uVar24 = (uint)uVar10;
                    uVar1 = *(ushort *)
                             (g_etc1_inverse_lookup +
                             (ulong)*(byte *)((long)&local_25c + local_230) * 2 +
                             (ulong)bVar16 * 0x200);
                    if ((bVar27 == 0) ||
                       ((((uVar24 & 0xff) -
                         (uint)(pcVar8->field_0).c
                               [(uint)(&rg_etc1::
                                        pack_etc1_block_solid_color_constrained(crnlib::rg_etc1::etc1_optimizer::results&,unsigned_int,unsigned_char_const*,bool,crnlib::rg_etc1::color_quad_u8_const*)
                                        ::s_next_comp)[uVar28]]) + 4 < 8 &&
                        (((uVar1 & 0xff) - (uint)(pcVar8->field_0).c[local_230]) + 4 < 8)))) {
                      uVar15 = (uint)(uVar10 >> 8);
                      uVar15 = (uint)(uVar1 >> 8) * (uint)(uVar1 >> 8) +
                               uVar15 * uVar15 + iVar18 * iVar18;
                      if (uVar15 < (uint)local_258) {
                        if (uVar15 == 0) {
                          uVar22 = uVar28 & 0xffffffff;
                          iVar11 = 0;
                          uVar23 = (uchar)uVar1;
                          uVar15 = (uint)uVar9;
                          goto LAB_00171e9c;
                        }
                        local_240 = (uint)uVar1;
                        local_23c = uVar24;
                        local_244 = (uint)uVar9;
                        local_1c0 = uVar28 & 0xffffffff;
                        local_258 = (ulong)uVar15;
                      }
                    }
                  }
                }
                uVar9 = *puVar35;
              } while (uVar9 != 0xffff);
            }
          }
          iVar11 = (int)local_258;
          uVar23 = (uchar)local_240;
          uVar15 = local_244;
          if (iVar11 != -1) {
LAB_00171e9c:
            results[2].m_error = (uint64)(uint)(iVar11 << 3);
            results[2].m_n = 8;
            results[2].m_block_color4 = (bool)(~(byte)uVar15 & 1);
            results[2].m_block_inten_table = uVar15 >> 1 & 7;
            *(ulong *)results[2].m_pSelectors =
                 ((ulong)(byte)((byte)uVar15 >> 4) & 3) * 0x101010101010101;
            results[2].m_block_color_unscaled.field_0.c[uVar22] = (uchar)(uVar15 >> 8);
            results[2].m_block_color_unscaled.field_0.c
            [(uint)(&rg_etc1::
                     pack_etc1_block_solid_color_constrained(crnlib::rg_etc1::etc1_optimizer::results&,unsigned_int,unsigned_char_const*,bool,crnlib::rg_etc1::color_quad_u8_const*)
                     ::s_next_comp)[uVar22]] = (uchar)uVar24;
            results[2].m_block_color_unscaled.field_0.c
            [(uint)(&rg_etc1::
                     pack_etc1_block_solid_color_constrained(crnlib::rg_etc1::etc1_optimizer::results&,unsigned_int,unsigned_char_const*,bool,crnlib::rg_etc1::color_quad_u8_const*)
                     ::s_next_comp)[(int)uVar22 + 1]] = uVar23;
          }
        }
LAB_00171f1d:
        local_1b8 = uVar6;
        local_108 = (undefined1)iVar36;
        local_f0 = lVar12 != 0 && iVar36 == 0;
        if ((bool)local_f0) {
          aStack_f4 = results[0].m_block_color_unscaled.field_0;
        }
        local_f8 = 9;
        local_100 = pack_etc1_block::s_scan_delta_0_to_4;
        if (local_120.m_quality != cCRNETCQualitySlow) {
          if (local_120.m_quality == cCRNETCQualityMedium) {
            local_f8 = 3;
            local_100 = pack_etc1_block::s_scan_delta_0_to_1;
          }
          else {
            local_f8 = 1;
            local_100 = pack_etc1_block::s_scan_delta_0;
          }
        }
        prVar32 = results + lVar12;
        etc1_optimizer::init(&context->m_optimizer,(EVP_PKEY_CTX *)&local_120);
        bVar37 = etc1_optimizer::compute(&context->m_optimizer);
        if (!bVar37) break;
        uVar14 = prVar32->m_error;
        if (3000 < uVar14 && local_120.m_quality != cCRNETCQualityFast) {
          local_f8 = 2;
          if (6000 < uVar14) {
            local_f8 = 8;
          }
          local_100 = pack_etc1_block::s_scan_delta_5_to_5;
          if (6000 < uVar14) {
            local_100 = pack_etc1_block::s_scan_delta_5_to_8;
          }
          if (local_120.m_quality == cCRNETCQualityMedium) {
            local_f8 = 4;
            local_100 = pack_etc1_block::s_scan_delta_2_to_3;
          }
          bVar37 = etc1_optimizer::compute(&context->m_optimizer);
          if (!bVar37) break;
          uVar14 = prVar32->m_error;
        }
        if (results[2].m_error < uVar14) {
          etc1_optimizer::results::operator=(prVar32,results + 2);
          uVar14 = prVar32->m_error;
        }
        uVar14 = local_1a0 + uVar14;
        lVar12 = lVar12 + 1;
      } while (uVar14 < uVar21);
    }
  }
  uVar2 = local_e0._0_1_;
  uVar3 = local_e0._1_1_;
  uVar4 = local_e0._2_1_;
  if (iVar17 != 0) {
    (dst_block->field_0).m_bytes[0] = local_e0._0_1_ << 4 | local_b8._0_1_;
    (dst_block->field_0).m_bytes[1] = local_e0._1_1_ << 4 | local_b8._1_1_;
    bVar16 = local_e0._2_1_ << 4 | local_b8._2_1_;
    goto LAB_00172232;
  }
  iVar11 = (local_b8.m_u32 & 0xff) - (local_e0.m_u32 & 0xff);
  iVar36 = (uint)(byte)local_b8._1_1_ - (uint)(byte)local_e0._1_1_;
  iVar18 = (uint)(byte)local_b8._2_1_ - (uint)(byte)local_e0._2_1_;
  iVar7 = iVar36;
  if (iVar11 < iVar36) {
    iVar7 = iVar11;
  }
  if (iVar18 <= iVar7) {
    iVar7 = iVar18;
  }
  if (iVar7 < -4) {
LAB_001721db:
    crnlib_assert("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/FrozenStormInteractive[P]Crunch2/crnlib/crn_etc.cpp"
                  ,0x6f0);
  }
  else {
    iVar7 = iVar36;
    if (iVar36 < iVar11) {
      iVar7 = iVar11;
    }
    if (iVar7 <= iVar18) {
      iVar7 = iVar18;
    }
    if (3 < iVar7) goto LAB_001721db;
  }
  (dst_block->field_0).m_bytes[0] = uVar2 << 3 | (char)iVar11 + (char)(iVar11 >> 0x1f) * -8;
  (dst_block->field_0).m_bytes[1] = uVar3 << 3 | (char)iVar36 + (char)(iVar36 >> 0x1f) * -8;
  bVar16 = uVar4 << 3 | (char)iVar18 + (char)(iVar18 >> 0x1f) * -8;
LAB_00172232:
  (dst_block->field_0).m_bytes[2] = bVar16;
  (dst_block->field_0).m_bytes[3] =
       (((char)iVar17 * '\x02' & 2U) + (char)local_1c8 * '\x04' | (byte)(local_248 << 5)) ^ 2 |
       (byte)local_24c;
  if (local_24c == 0) {
    uVar10 = 0;
    uVar9 = 0;
    for (uVar24 = 1; -1 < (int)uVar24; uVar24 = uVar24 - 1) {
      pauVar13 = local_d0[(ulong)uVar24 * 5];
      for (lVar12 = 7; (int)lVar12 != -1; lVar12 = lVar12 + -4) {
        uVar1 = (ushort)*(byte *)((long)&g_selector_index_to_etc1 + (ulong)(*pauVar13)[lVar12]) * 2;
        uVar30 = (ushort)*(byte *)((long)&g_selector_index_to_etc1 + (ulong)pauVar13[-1][lVar12 + 7]
                                  );
        bVar16 = *(byte *)((long)&g_selector_index_to_etc1 + (ulong)pauVar13[-1][lVar12 + 6]);
        bVar27 = *(byte *)((long)&g_selector_index_to_etc1 + (ulong)pauVar13[-1][lVar12 + 5]);
        uVar10 = bVar27 & 1 | (uVar30 & 1 | (uVar1 & 2) + uVar10 * 4) * 4 + (bVar16 & 1) * 2;
        uVar9 = (ushort)(bVar27 >> 1) | bVar16 & 0xfffe |
                (uVar30 & 0xfffe | uVar9 << 3 | uVar1 & 0xfffc) * 2;
      }
    }
  }
  else {
    uVar15 = 0;
    lVar12 = 0xf;
    uVar24 = 0;
    while( true ) {
      uVar10 = (ushort)uVar15;
      uVar9 = (ushort)uVar24;
      if ((int)(lVar12 - 0xcU) < 0) break;
      uVar14 = lVar12 - 0xcU & 0xffffffff;
      uVar20 = (uint)*(byte *)((long)&g_selector_index_to_etc1 + (ulong)best_selectors[0][lVar12]) *
               2;
      uVar25 = (uint)*(byte *)((long)&g_selector_index_to_etc1 + (ulong)best_selectors[1][uVar14]);
      bVar16 = *(byte *)((long)&g_selector_index_to_etc1 + (ulong)best_selectors[-1][lVar12]);
      bVar27 = *(byte *)((long)&g_selector_index_to_etc1 + (ulong)best_selectors[0][uVar14]);
      uVar15 = bVar27 & 1 | (uVar25 & 1 | (uVar20 & 2) + uVar15 * 4) * 4 + (bVar16 & 1) * 2;
      uVar24 = (uint)(bVar27 >> 1) | bVar16 & 0xfffffffe |
               (uVar25 & 0xfffffffe | uVar20 & 0xfffffffc | uVar24 << 3) * 2;
      lVar12 = lVar12 + -1;
    }
  }
  (dst_block->field_0).m_bytes[4] = (uint8)(uVar9 >> 8);
  (dst_block->field_0).m_bytes[5] = (uint8)uVar9;
  (dst_block->field_0).m_bytes[6] = (uint8)(uVar10 >> 8);
  (dst_block->field_0).m_bytes[7] = (uint8)uVar10;
  return uVar21;
code_r0x00171c38:
  if (((*(char *)((long)&local_1e8 + uVar14 * 4) != (char)local_1b8) ||
      (*(char *)((long)&local_1e8 + uVar14 * 4 + 1) != local_1b8._1_1_)) ||
     (lVar29 = uVar14 * 4, uVar14 = (ulong)uVar24,
     *(char *)((long)&local_1e8 + lVar29 + 2) != local_1b8._2_1_)) goto LAB_00171f1d;
  goto LAB_00171c33;
}

Assistant:

uint64 pack_etc1_block(etc1_block& dst_block, const color_quad_u8* pSrc_pixels, crn_etc1_pack_params& pack_params, pack_etc1_block_context& context)
    {
        color_quad_u8 src_pixel0(pSrc_pixels[0]);

        int r;
        for (r = 15; r >= 1; --r)
        {
            if ((pSrc_pixels[r].r != src_pixel0.r) || (pSrc_pixels[r].g != src_pixel0.g) || (pSrc_pixels[r].b != src_pixel0.b))
            {
                break;
            }
        }
        if (!r)
        {
            return 16 * pack_etc1_block_solid_color(dst_block, &pSrc_pixels[0].r, pack_params, context);
        }

        color_quad_u8 dithered_pixels[16];
        if (pack_params.m_dithering)
        {
            DitherBlock(dithered_pixels, pSrc_pixels);
            pSrc_pixels = dithered_pixels;
        }

        uint64 best_error = cUINT64_MAX;
        uint best_flip = false, best_use_color4 = false;

        uint8 best_selectors[2][8];
        etc1_optimizer::results best_results[2];
        for (uint i = 0; i < 2; i++)
        {
            best_results[i].m_n = 8;
            best_results[i].m_pSelectors = best_selectors[i];
        }

        uint8 selectors[3][8];
        etc1_optimizer::results results[3];

        for (uint i = 0; i < 3; i++)
        {
            results[i].m_n = 8;
            results[i].m_pSelectors = selectors[i];
        }

        color_quad_u8 subblock_pixels[8];

        etc1_optimizer::params params(pack_params);
        params.m_num_src_pixels = 8;
        params.m_pSrc_pixels = subblock_pixels;

        for (uint flip = 0; flip < 2; flip++)
        {
            for (uint use_color4 = 0; use_color4 < 2; use_color4++)
            {
                uint64 trial_error = 0;

                uint subblock;
                for (subblock = 0; subblock < 2; subblock++)
                {
                    if (flip)
                    {
                        memcpy(subblock_pixels, pSrc_pixels + subblock * 8, sizeof(color_quad_u8) * 8);
                    }
                    else
                    {
                        const color_quad_u8* pSrc_col = pSrc_pixels + subblock * 2;
                        subblock_pixels[0] = pSrc_col[0];
                        subblock_pixels[1] = pSrc_col[4];
                        subblock_pixels[2] = pSrc_col[8];
                        subblock_pixels[3] = pSrc_col[12];
                        subblock_pixels[4] = pSrc_col[1];
                        subblock_pixels[5] = pSrc_col[5];
                        subblock_pixels[6] = pSrc_col[9];
                        subblock_pixels[7] = pSrc_col[13];
                    }

                    results[2].m_error = cUINT64_MAX;
                    if ((params.m_quality >= cCRNETCQualityMedium) && ((subblock) || (use_color4)))
                    {
                        color_quad_u8 subblock_pixel0(subblock_pixels[0]);
                        for (r = 7; r >= 1; --r)
                        {
                            if ((subblock_pixels[r].r != subblock_pixel0.r) || (subblock_pixels[r].g != subblock_pixel0.g) || (subblock_pixels[r].b != subblock_pixel0.b))
                            {
                                break;
                            }
                        }
                        if (!r)
                        {
                            pack_etc1_block_solid_color_constrained(results[2], 8, &subblock_pixel0.r, pack_params, context, !use_color4, (subblock && !use_color4) ? &results[0].m_block_color_unscaled : nullptr);
                        }
                    }

                    params.m_use_color4 = (use_color4 != 0);
                    params.m_constrain_against_base_color5 = false;

                    if ((!use_color4) && (subblock))
                    {
                        params.m_constrain_against_base_color5 = true;
                        params.m_base_color5 = results[0].m_block_color_unscaled;
                    }

                    if (params.m_quality == cCRNETCQualitySlow)
                    {
                        static const int s_scan_delta_0_to_4[] = { -4, -3, -2, -1, 0, 1, 2, 3, 4 };
                        params.m_scan_delta_size = CRNLIB_ARRAY_SIZE(s_scan_delta_0_to_4);
                        params.m_pScan_deltas = s_scan_delta_0_to_4;
                    }
                    else if (params.m_quality == cCRNETCQualityMedium)
                    {
                        static const int s_scan_delta_0_to_1[] = { -1, 0, 1 };
                        params.m_scan_delta_size = CRNLIB_ARRAY_SIZE(s_scan_delta_0_to_1);
                        params.m_pScan_deltas = s_scan_delta_0_to_1;
                    }
                    else
                    {
                        static const int s_scan_delta_0[] = { 0 };
                        params.m_scan_delta_size = CRNLIB_ARRAY_SIZE(s_scan_delta_0);
                        params.m_pScan_deltas = s_scan_delta_0;
                    }

                    context.m_optimizer.init(params, results[subblock]);

                    if (!context.m_optimizer.compute())
                    {
                        break;
                    }

                    // Fairly arbitrary/unrefined thresholds that control how far away to scan for potentially better solutions.
                    const uint refinement_error_thresh0 = 3000;
                    const uint refinement_error_thresh1 = 6000;
                    if ((params.m_quality >= cCRNETCQualityMedium) && (results[subblock].m_error > refinement_error_thresh0))
                    {
                        if (params.m_quality == cCRNETCQualityMedium)
                        {
                            static const int s_scan_delta_2_to_3[] = { -3, -2, 2, 3 };
                            params.m_scan_delta_size = CRNLIB_ARRAY_SIZE(s_scan_delta_2_to_3);
                            params.m_pScan_deltas = s_scan_delta_2_to_3;
                        }
                        else
                        {
                            static const int s_scan_delta_5_to_5[] = { -5, 5 };
                            static const int s_scan_delta_5_to_8[] = { -8, -7, -6, -5, 5, 6, 7, 8 };
                            if (results[subblock].m_error > refinement_error_thresh1)
                            {
                                params.m_scan_delta_size = CRNLIB_ARRAY_SIZE(s_scan_delta_5_to_8);
                                params.m_pScan_deltas = s_scan_delta_5_to_8;
                            }
                            else
                            {
                                params.m_scan_delta_size = CRNLIB_ARRAY_SIZE(s_scan_delta_5_to_5);
                                params.m_pScan_deltas = s_scan_delta_5_to_5;
                            }
                        }

                        if (!context.m_optimizer.compute())
                        {
                            break;
                        }
                    }

                    if (results[2].m_error < results[subblock].m_error)
                    {
                        results[subblock] = results[2];
                    }

                    trial_error += results[subblock].m_error;
                    if (trial_error >= best_error)
                    {
                        break;
                    }
                }

                if (subblock < 2)
                {
                    continue;
                }

                best_error = trial_error;
                best_results[0] = results[0];
                best_results[1] = results[1];
                best_flip = flip;
                best_use_color4 = use_color4;

            } // use_color4

        } // flip

        int dr = best_results[1].m_block_color_unscaled.r - best_results[0].m_block_color_unscaled.r;
        int dg = best_results[1].m_block_color_unscaled.g - best_results[0].m_block_color_unscaled.g;
        int db = best_results[1].m_block_color_unscaled.b - best_results[0].m_block_color_unscaled.b;
        if (!best_use_color4)
        {
            if ((math::minimum(dr, dg, db) < cETC1ColorDeltaMin) || (math::maximum(dr, dg, db) > cETC1ColorDeltaMax))
            {
                // Shouldn't ever happen
                CRNLIB_VERIFY(0);
            }
        }

        if (best_use_color4)
        {
            dst_block.m_bytes[0] = static_cast<uint8>(best_results[1].m_block_color_unscaled.r | (best_results[0].m_block_color_unscaled.r << 4));
            dst_block.m_bytes[1] = static_cast<uint8>(best_results[1].m_block_color_unscaled.g | (best_results[0].m_block_color_unscaled.g << 4));
            dst_block.m_bytes[2] = static_cast<uint8>(best_results[1].m_block_color_unscaled.b | (best_results[0].m_block_color_unscaled.b << 4));
        }
        else
        {
            if (dr < 0)
            {
                dr += 8;
            }
            if (dg < 0)
            {
                dg += 8;
            }
            if (db < 0)
            {
                db += 8;
            }
            dst_block.m_bytes[0] = static_cast<uint8>((best_results[0].m_block_color_unscaled.r << 3) | dr);
            dst_block.m_bytes[1] = static_cast<uint8>((best_results[0].m_block_color_unscaled.g << 3) | dg);
            dst_block.m_bytes[2] = static_cast<uint8>((best_results[0].m_block_color_unscaled.b << 3) | db);
        }

        dst_block.m_bytes[3] = static_cast<uint8>((best_results[1].m_block_inten_table << 2) | (best_results[0].m_block_inten_table << 5) | ((~best_use_color4 & 1) << 1) | best_flip);

        uint selector0 = 0, selector1 = 0;
        if (best_flip)
        {
            // flipped:
            // { 0, 0 }, { 1, 0 }, { 2, 0 }, { 3, 0 },
            // { 0, 1 }, { 1, 1 }, { 2, 1 }, { 3, 1 }
            //
            // { 0, 2 }, { 1, 2 }, { 2, 2 }, { 3, 2 },
            // { 0, 3 }, { 1, 3 }, { 2, 3 }, { 3, 3 }
            const uint8* pSelectors0 = best_results[0].m_pSelectors;
            const uint8* pSelectors1 = best_results[1].m_pSelectors;
            for (int x = 3; x >= 0; --x)
            {
                uint b;
                b = g_selector_index_to_etc1[pSelectors1[4 + x]];
                selector0 = (selector0 << 1) | (b & 1);
                selector1 = (selector1 << 1) | (b >> 1);

                b = g_selector_index_to_etc1[pSelectors1[x]];
                selector0 = (selector0 << 1) | (b & 1);
                selector1 = (selector1 << 1) | (b >> 1);

                b = g_selector_index_to_etc1[pSelectors0[4 + x]];
                selector0 = (selector0 << 1) | (b & 1);
                selector1 = (selector1 << 1) | (b >> 1);

                b = g_selector_index_to_etc1[pSelectors0[x]];
                selector0 = (selector0 << 1) | (b & 1);
                selector1 = (selector1 << 1) | (b >> 1);
            }
        }
        else
        {
            // non-flipped:
            // { 0, 0 }, { 0, 1 }, { 0, 2 }, { 0, 3 },
            // { 1, 0 }, { 1, 1 }, { 1, 2 }, { 1, 3 }
            //
            // { 2, 0 }, { 2, 1 }, { 2, 2 }, { 2, 3 },
            // { 3, 0 }, { 3, 1 }, { 3, 2 }, { 3, 3 }
            for (int subblock = 1; subblock >= 0; --subblock)
            {
                const uint8* pSelectors = best_results[subblock].m_pSelectors + 4;
                for (uint i = 0; i < 2; i++)
                {
                    uint b;
                    b = g_selector_index_to_etc1[pSelectors[3]];
                    selector0 = (selector0 << 1) | (b & 1);
                    selector1 = (selector1 << 1) | (b >> 1);

                    b = g_selector_index_to_etc1[pSelectors[2]];
                    selector0 = (selector0 << 1) | (b & 1);
                    selector1 = (selector1 << 1) | (b >> 1);

                    b = g_selector_index_to_etc1[pSelectors[1]];
                    selector0 = (selector0 << 1) | (b & 1);
                    selector1 = (selector1 << 1) | (b >> 1);

                    b = g_selector_index_to_etc1[pSelectors[0]];
                    selector0 = (selector0 << 1) | (b & 1);
                    selector1 = (selector1 << 1) | (b >> 1);

                    pSelectors -= 4;
                }
            }
        }

        dst_block.m_bytes[4] = static_cast<uint8>(selector1 >> 8);
        dst_block.m_bytes[5] = static_cast<uint8>(selector1 & 0xFF);
        dst_block.m_bytes[6] = static_cast<uint8>(selector0 >> 8);
        dst_block.m_bytes[7] = static_cast<uint8>(selector0 & 0xFF);

        return best_error;
    }